

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.c
# Opt level: O0

XXH64_hash_t XXH64_digest(XXH64_state_t *state_in)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  U64 UVar6;
  XXH_endianess endian_detected;
  XXH64_state_t *state_in_local;
  U64 v4_1;
  U64 v3_1;
  U64 v2_1;
  U64 v1_1;
  U64 h64_1;
  U64 v4;
  U64 v3;
  U64 v2;
  U64 v1;
  U64 h64;
  
  iVar5 = XXH_isLittleEndian();
  if (iVar5 == 1) {
    if (state_in->total_len < 0x20) {
      v1 = state_in->v3 + 0x27d4eb2f165667c5;
    }
    else {
      uVar1 = state_in->v1;
      uVar2 = state_in->v2;
      uVar3 = state_in->v3;
      uVar4 = state_in->v4;
      UVar6 = XXH64_mergeRound((uVar1 << 1 | uVar1 >> 0x3f) + (uVar2 << 7 | uVar2 >> 0x39) +
                               (uVar3 << 0xc | uVar3 >> 0x34) + (uVar4 << 0x12 | uVar4 >> 0x2e),
                               uVar1);
      UVar6 = XXH64_mergeRound(UVar6,uVar2);
      UVar6 = XXH64_mergeRound(UVar6,uVar3);
      v1 = XXH64_mergeRound(UVar6,uVar4);
    }
    state_in_local =
         (XXH64_state_t *)
         XXH64_finalize(state_in->total_len + v1,state_in->mem64,state_in->total_len,
                        XXH_littleEndian,XXH_aligned);
  }
  else {
    if (state_in->total_len < 0x20) {
      v1_1 = state_in->v3 + 0x27d4eb2f165667c5;
    }
    else {
      uVar1 = state_in->v1;
      uVar2 = state_in->v2;
      uVar3 = state_in->v3;
      uVar4 = state_in->v4;
      UVar6 = XXH64_mergeRound((uVar1 << 1 | uVar1 >> 0x3f) + (uVar2 << 7 | uVar2 >> 0x39) +
                               (uVar3 << 0xc | uVar3 >> 0x34) + (uVar4 << 0x12 | uVar4 >> 0x2e),
                               uVar1);
      UVar6 = XXH64_mergeRound(UVar6,uVar2);
      UVar6 = XXH64_mergeRound(UVar6,uVar3);
      v1_1 = XXH64_mergeRound(UVar6,uVar4);
    }
    state_in_local =
         (XXH64_state_t *)
         XXH64_finalize(state_in->total_len + v1_1,state_in->mem64,state_in->total_len,XXH_bigEndian
                        ,XXH_aligned);
  }
  return (XXH64_hash_t)state_in_local;
}

Assistant:

XXH_PUBLIC_API unsigned long long XXH64_digest (const XXH64_state_t* state_in)
{
    XXH_endianess endian_detected = (XXH_endianess)XXH_CPU_LITTLE_ENDIAN;

    if ((endian_detected==XXH_littleEndian) || XXH_FORCE_NATIVE_FORMAT)
        return XXH64_digest_endian(state_in, XXH_littleEndian);
    else
        return XXH64_digest_endian(state_in, XXH_bigEndian);
}